

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.cpp
# Opt level: O3

void __thiscall CaDiCaL::External::remove_observed_var(External *this,int elit)

{
  ulong *puVar1;
  ulong uVar2;
  
  if (this->propagator != (ExternalPropagator *)0x0) {
    uVar2 = (ulong)(uint)-elit;
    if (0 < elit) {
      uVar2 = (ulong)(uint)elit;
    }
    if ((int)uVar2 <= this->max_var) {
      if (((this->is_observed).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] >>
           (uVar2 & 0x3f) & 1) != 0) {
        Internal::remove_observed_var
                  (this->internal,
                   (this->e2i).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2]);
        puVar1 = (this->is_observed).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar2 >> 6);
        *puVar1 = *puVar1 & ~(1L << ((byte)uVar2 & 0x3f));
        melt(this,elit);
        return;
      }
    }
  }
  return;
}

Assistant:

void External::remove_observed_var (int elit) {
  if (!propagator) {
    LOG ("No connected propagator that could have watched the variable");
    return;
  }
  int eidx = abs (elit);

  if (eidx > max_var)
    return;

  if (is_observed[eidx]) {
    // Follow opposite order of add_observed_var, first remove internal
    // is_observed
    int ilit = e2i[eidx]; // internalize (elit);
    internal->remove_observed_var (ilit);

    is_observed[eidx] = false;
    melt (elit);
    LOG ("unmarking %d as externally watched", eidx);
  }
}